

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::is_empty(path *p)

{
  bool bVar1;
  uintmax_t uVar2;
  directory_iterator local_38;
  directory_iterator local_28;
  
  status((filesystem *)&local_38,p);
  if ((int)local_38._impl.
           super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr == 3) {
    directory_iterator::directory_iterator(&local_38,p);
    directory_iterator::directory_iterator(&local_28);
    bVar1 = operator==((path *)(CONCAT44(local_38._impl.
                                         super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         (int)local_38._impl.
                                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr) + 0x28),
                       &(local_28._impl.
                         super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_current);
    if (local_28._impl.
        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_38._impl.
        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    uVar2 = file_size(p);
    bVar1 = uVar2 == 0;
  }
  return bVar1;
}

Assistant:

GHC_INLINE bool is_empty(const path& p)
{
    if (is_directory(p)) {
        return directory_iterator(p) == directory_iterator();
    }
    else {
        return file_size(p) == 0;
    }
}